

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O2

extent_t *
extent_try_coalesce_impl
          (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,rtree_ctx_t *rtree_ctx,
          extents_t *extents,extent_t *extent,_Bool *coalesced,_Bool growing_retained,
          _Bool inactive_only)

{
  bool bVar1;
  _Bool _Var2;
  extent_t *peVar3;
  extents_t *peVar4;
  undefined1 in_stack_ffffffffffffffb0;
  
  do {
    peVar3 = extent_lock_from_addr
                       (tsdn,rtree_ctx,
                        (void *)(((extent->field_2).e_size_esn & 0xfffffffffffff000) +
                                ((ulong)extent->e_addr & 0xfffffffffffff000)),growing_retained);
    if (peVar3 == (extent_t *)0x0) {
LAB_00124cb8:
      bVar1 = false;
    }
    else {
      peVar4 = extents;
      _Var2 = extent_can_coalesce(arena,extents,extent,peVar3);
      extent_unlock((tsdn_t *)peVar3,(extent_t *)peVar4);
      if (_Var2) {
        _Var2 = extent_coalesce(tsdn,arena,r_extent_hooks,extents,extent,peVar3,true,
                                (_Bool)in_stack_ffffffffffffffb0);
        if (_Var2) goto LAB_00124cb8;
        bVar1 = true;
        _Var2 = true;
        peVar3 = extent;
        if (extents->delay_coalesce != false) goto LAB_00124d79;
      }
      else {
        bVar1 = false;
      }
    }
    peVar3 = extent_lock_from_addr
                       (tsdn,rtree_ctx,
                        (void *)(((ulong)extent->e_addr & 0xfffffffffffff000) - 0x1000),
                        growing_retained);
    if (peVar3 != (extent_t *)0x0) {
      peVar4 = extents;
      _Var2 = extent_can_coalesce(arena,extents,extent,peVar3);
      extent_unlock((tsdn_t *)peVar3,(extent_t *)peVar4);
      if ((_Var2) &&
         (_Var2 = extent_coalesce(tsdn,arena,r_extent_hooks,extents,extent,peVar3,false,
                                  (_Bool)in_stack_ffffffffffffffb0), !_Var2)) {
        bVar1 = true;
        _Var2 = true;
        extent = peVar3;
        if (extents->delay_coalesce != false) goto LAB_00124d79;
      }
    }
  } while (bVar1);
  peVar3 = extent;
  if (extents->delay_coalesce == true) {
    _Var2 = false;
LAB_00124d79:
    *coalesced = _Var2;
  }
  return peVar3;
}

Assistant:

static extent_t *
extent_try_coalesce_impl(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, rtree_ctx_t *rtree_ctx, extents_t *extents,
    extent_t *extent, bool *coalesced, bool growing_retained,
    bool inactive_only) {
	/*
	 * We avoid checking / locking inactive neighbors for large size
	 * classes, since they are eagerly coalesced on deallocation which can
	 * cause lock contention.
	 */
	/*
	 * Continue attempting to coalesce until failure, to protect against
	 * races with other threads that are thwarted by this one.
	 */
	bool again;
	do {
		again = false;

		/* Try to coalesce forward. */
		extent_t *next = extent_lock_from_addr(tsdn, rtree_ctx,
		    extent_past_get(extent), inactive_only);
		if (next != NULL) {
			/*
			 * extents->mtx only protects against races for
			 * like-state extents, so call extent_can_coalesce()
			 * before releasing next's pool lock.
			 */
			bool can_coalesce = extent_can_coalesce(arena, extents,
			    extent, next);

			extent_unlock(tsdn, next);

			if (can_coalesce && !extent_coalesce(tsdn, arena,
			    r_extent_hooks, extents, extent, next, true,
			    growing_retained)) {
				if (extents->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return extent;
				}
				again = true;
			}
		}

		/* Try to coalesce backward. */
		extent_t *prev = extent_lock_from_addr(tsdn, rtree_ctx,
		    extent_before_get(extent), inactive_only);
		if (prev != NULL) {
			bool can_coalesce = extent_can_coalesce(arena, extents,
			    extent, prev);
			extent_unlock(tsdn, prev);

			if (can_coalesce && !extent_coalesce(tsdn, arena,
			    r_extent_hooks, extents, extent, prev, false,
			    growing_retained)) {
				extent = prev;
				if (extents->delay_coalesce) {
					/* Do minimal coalescing. */
					*coalesced = true;
					return extent;
				}
				again = true;
			}
		}
	} while (again);

	if (extents->delay_coalesce) {
		*coalesced = false;
	}
	return extent;
}